

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O2

int t3_compare_case_fold(wchar_t *a,size_t alen,char *b,size_t blen,size_t *bmatchlen)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  int iVar5;
  Utf8FoldStr bp;
  CVmCaseFoldStr ap;
  
  pwVar1 = ap.ie;
  ap.fp = ap.ie + 1;
  ap.ie[1] = L'\0';
  pwVar2 = bp.ie;
  bp.fp = bp.ie + 1;
  bp.ie[1] = L'\0';
  bp.fpbase = pwVar2;
  bp.p.p_ = b;
  bp.rem = blen;
  ap.fpbase = pwVar1;
  ap.p = a;
  ap.rem = alen;
  do {
    iVar5 = 1;
    if ((ap.rem == 0) && (ap.fp != pwVar1 && *ap.fp == L'\0')) {
      wVar3 = L'\0';
      if (bmatchlen == (size_t *)0x0) goto LAB_001f5a8e;
LAB_001f5a4e:
      if (((ap.fp != pwVar1 && wVar3 == L'\0') && (wVar3 = L'\0', bp.fp != bp.fpbase)) &&
         (*bp.fp == L'\0')) {
        *bmatchlen = (long)bp.p.p_ - (long)b;
        return 0;
      }
LAB_001f5a8e:
      if (((ap.fp != pwVar1 && wVar3 == L'\0') && (iVar5 = -1, bp.rem == 0)) && (*bp.fp == L'\0')) {
        iVar5 = -(uint)(bp.fp == pwVar2);
      }
      return iVar5;
    }
    if ((bp.rem == 0) && (bp.fp != pwVar2 && *bp.fp == L'\0')) {
      if (bmatchlen == (size_t *)0x0) {
        if (ap.rem != 0) {
          return 1;
        }
        wVar3 = *ap.fp;
        goto LAB_001f5a8e;
      }
      if (ap.rem != 0) {
        return 1;
      }
      wVar3 = *ap.fp;
      goto LAB_001f5a4e;
    }
    wVar3 = CVmCaseFoldStr::getch(&ap);
    wVar4 = Utf8FoldStr::getch(&bp);
    if (wVar3 - wVar4 != 0) {
      return wVar3 - wVar4;
    }
  } while( true );
}

Assistant:

int t3_compare_case_fold(
    const wchar_t *a, size_t alen,
    const char *b, size_t blen, size_t *bmatchlen)
{
    /* set up folded-case string readers for the two strings */
    CVmCaseFoldStr ap(a, alen);
    Utf8FoldStr bp(b, blen);

    /* scan until we find a mismatch or run out of one string */
    while (ap.more() && bp.more())
    {
        /* get the next character of each string */
        wchar_t ach = ap.getch(), bch = bp.getch();

        /* if they're different, return the sign difference */
        if (ach != bch)
            return ach - bch;
    }

    /* 
     *   if 'a' ran out first, and we have a 'bmatchlen' pointer, then we're
     *   being asked if 'a' is a leading substring of 'b', which it is - fill
     *   in '*bmatchlen' with the length of 'b' that we matched, and return
     *   ture 
     */
    if (bmatchlen != 0 && !ap.more() && bp.at_boundary())
    {
        *bmatchlen = bp.getptr() - b;
        return 0;
    }

    /* which ran out first was shorter, so sorts first */
    return ap.more() ? 1 : bp.more() ? -1 : 0;
}